

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.cpp
# Opt level: O0

void InitParametersFromDefinitions
               (InternalEffectDefinitionRegistrationCallback registereffectdefcallback,float *params
               )

{
  uint local_a4;
  undefined1 local_a0 [4];
  UInt32 n;
  UnityAudioEffectDefinition definition;
  float *params_local;
  InternalEffectDefinitionRegistrationCallback registereffectdefcallback_local;
  
  definition.getfloatbuffer = (UnityAudioEffect_GetFloatBufferCallback)params;
  memset(local_a0,0,0x88);
  (*registereffectdefcallback)((UnityAudioEffectDefinition *)local_a0);
  for (local_a4 = 0; local_a4 < definition.pluginversion; local_a4 = local_a4 + 1) {
    *(undefined4 *)(definition.getfloatbuffer + (ulong)local_a4 * 4) =
         *(undefined4 *)(definition.setposition + (ulong)local_a4 * 0x40 + 0x30);
    if (*(void **)(definition.setposition + (ulong)local_a4 * 0x40 + 0x20) != (void *)0x0) {
      operator_delete__(*(void **)(definition.setposition + (ulong)local_a4 * 0x40 + 0x20));
    }
  }
  if (definition.setposition != (UnityAudioEffect_SetPositionCallback)0x0) {
    operator_delete__(definition.setposition);
  }
  return;
}

Assistant:

void InitParametersFromDefinitions(
    InternalEffectDefinitionRegistrationCallback registereffectdefcallback,
    float* params
    )
{
    UnityAudioEffectDefinition definition;
    memset(&definition, 0, sizeof(definition));
    registereffectdefcallback(definition);
    for (UInt32 n = 0; n < definition.numparameters; n++)
    {
        params[n] = definition.paramdefs[n].defaultval;
        delete[] definition.paramdefs[n].description;
    }
    delete[] definition.paramdefs; // assumes that definition.paramdefs was allocated by registereffectdefcallback or is NULL
}